

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

Style ON_Font::FontStyleFromUnsigned(uint unsigned_font_style)

{
  uint uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = unsigned_font_style - 1;
  if (uVar1 < 3) {
    return (char)uVar1 + Upright;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
             ,0x1a60,"","unsigned_font_style is not valid",in_R8,in_R9,(ulong)uVar1);
  return Upright;
}

Assistant:

ON_Font::Style ON_Font::FontStyleFromUnsigned(
  unsigned int unsigned_font_style
  )
{
  switch (unsigned_font_style)
  {
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Upright);
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Italic);
  ON_ENUM_FROM_UNSIGNED_CASE( ON_Font::Style::Oblique);
  default:
    break;
  }
  ON_ERROR("unsigned_font_style is not valid");
  return ON_Font::Style::Upright;
}